

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

void google::protobuf::internal::anon_unknown_23::Register
               (MessageLite *containing_type,int number,ExtensionInfo info)

{
  __node_base *p_Var1;
  size_type *psVar2;
  __node_base_ptr p_Var3;
  __buckets_ptr pp_Var4;
  int iVar5;
  _Hash_node_base *p_Var6;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var7;
  LogMessage *pLVar8;
  unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
  *puVar9;
  _Hash_node_base *p_Var10;
  ulong uVar11;
  size_type __n;
  pointer __ptr_1;
  __node_base _Var12;
  ulong uVar13;
  _Hash_node_base *p_Var14;
  undefined1 auVar15 [16];
  __buckets_alloc_type __alloc;
  LogFinisher local_91;
  size_t local_90;
  string local_88;
  LogMessage local_68;
  
  if (((anonymous_namespace)::
       Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
       ::local_static_registry == '\0') &&
     (iVar5 = __cxa_guard_acquire(&(anonymous_namespace)::
                                   Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                                   ::local_static_registry), iVar5 != 0)) {
    puVar9 = (unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>
              *)operator_new(0x38);
    (puVar9->_M_h)._M_buckets = &(puVar9->_M_h)._M_single_bucket;
    (puVar9->_M_h)._M_bucket_count = 1;
    (puVar9->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    (puVar9->_M_h)._M_element_count = 0;
    (puVar9->_M_h)._M_rehash_policy._M_max_load_factor = 1.0;
    (puVar9->_M_h)._M_rehash_policy._M_next_resize = 0;
    (puVar9->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    OnShutdownRun(OnShutdownDelete<std::unordered_map<std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_std::equal_to<std::pair<const_google::protobuf::MessageLite_*,_int>_>,_std::allocator<std::pair<const_std::pair<const_google::protobuf::MessageLite_*,_int>,_google::protobuf::internal::ExtensionInfo>_>_>_>
                  ::anon_class_1_0_00000001::__invoke,puVar9);
    Register::local_static_registry = puVar9;
    __cxa_guard_release(&(anonymous_namespace)::
                         Register(google::protobuf::MessageLite_const*,int,google::protobuf::internal::ExtensionInfo)
                         ::local_static_registry);
  }
  puVar9 = Register::local_static_registry;
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  p_Var14 = (_Hash_node_base *)((long)number ^ (ulong)containing_type);
  uVar13 = (Register::local_static_registry->_M_h)._M_bucket_count;
  uVar11 = (ulong)p_Var14 % uVar13;
  p_Var3 = (Register::local_static_registry->_M_h)._M_buckets[uVar11];
  if (p_Var3 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var3->_M_nxt;
    p_Var10 = p_Var6[7]._M_nxt;
    do {
      if (((p_Var10 == p_Var14) && (p_Var6[1]._M_nxt == (_Hash_node_base *)containing_type)) &&
         (*(int *)&p_Var6[2]._M_nxt == number)) {
        LogMessage::LogMessage
                  (&local_68,LOGLEVEL_FATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/protobuf/src/google/protobuf/extension_set.cc"
                   ,0x6c);
        pLVar8 = LogMessage::operator<<(&local_68,"Multiple extension registrations for type \"");
        (*containing_type->_vptr_MessageLite[2])(&local_88,containing_type);
        pLVar8 = LogMessage::operator<<(pLVar8,&local_88);
        pLVar8 = LogMessage::operator<<(pLVar8,"\", field number ");
        pLVar8 = LogMessage::operator<<(pLVar8,number);
        pLVar8 = LogMessage::operator<<(pLVar8,".");
        LogFinisher::operator=(&local_91,pLVar8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p != &local_88.field_2) {
          operator_delete(local_88._M_dataplus._M_p);
        }
        LogMessage::~LogMessage(&local_68);
        return;
      }
      p_Var6 = p_Var6->_M_nxt;
    } while ((p_Var6 != (_Hash_node_base *)0x0) &&
            (p_Var10 = p_Var6[7]._M_nxt, (ulong)p_Var10 % uVar13 == uVar11));
  }
  p_Var6 = (_Hash_node_base *)operator_new(0x40);
  p_Var6->_M_nxt = (_Hash_node_base *)0x0;
  p_Var6[1]._M_nxt = (_Hash_node_base *)containing_type;
  *(int *)&p_Var6[2]._M_nxt = number;
  p_Var6[3]._M_nxt = (_Hash_node_base *)info._0_8_;
  p_Var6[4]._M_nxt = (_Hash_node_base *)info.field_3.enum_validity_check.func;
  p_Var6[5]._M_nxt = (_Hash_node_base *)info.field_3.enum_validity_check.arg;
  p_Var6[6]._M_nxt = (_Hash_node_base *)info.descriptor;
  local_90 = (puVar9->_M_h)._M_rehash_policy._M_next_resize;
  auVar15 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(puVar9->_M_h)._M_rehash_policy,(puVar9->_M_h)._M_bucket_count,
                       (puVar9->_M_h)._M_element_count);
  __n = auVar15._8_8_;
  if ((auVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = (puVar9->_M_h)._M_buckets;
  }
  else {
    if (__n == 1) {
      __s = &(puVar9->_M_h)._M_single_bucket;
      (puVar9->_M_h)._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      ((new_allocator<std::__detail::_Hash_node_base_*> *)&local_68,__n,(void *)0x0)
      ;
      memset(__s,0,__n * 8);
    }
    _Var12._M_nxt = (puVar9->_M_h)._M_before_begin._M_nxt;
    (puVar9->_M_h)._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var12._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(puVar9->_M_h)._M_before_begin;
      uVar13 = 0;
      do {
        p_Var10 = (_Var12._M_nxt)->_M_nxt;
        uVar11 = (ulong)_Var12._M_nxt[7]._M_nxt % __n;
        if (__s[uVar11] == (__node_base_ptr)0x0) {
          (_Var12._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var12._M_nxt;
          __s[uVar11] = p_Var1;
          if ((_Var12._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var7 = __s + uVar13;
            goto LAB_003849a6;
          }
        }
        else {
          (_Var12._M_nxt)->_M_nxt = __s[uVar11]->_M_nxt;
          pp_Var7 = &__s[uVar11]->_M_nxt;
          uVar11 = uVar13;
LAB_003849a6:
          *pp_Var7 = _Var12._M_nxt;
        }
        _Var12._M_nxt = p_Var10;
        uVar13 = uVar11;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
    pp_Var4 = (puVar9->_M_h)._M_buckets;
    if (&(puVar9->_M_h)._M_single_bucket != pp_Var4) {
      operator_delete(pp_Var4);
    }
    (puVar9->_M_h)._M_bucket_count = __n;
    (puVar9->_M_h)._M_buckets = __s;
    uVar11 = (ulong)p_Var14 % __n;
  }
  p_Var6[7]._M_nxt = p_Var14;
  if (__s[uVar11] == (__node_base_ptr)0x0) {
    p_Var14 = (puVar9->_M_h)._M_before_begin._M_nxt;
    p_Var6->_M_nxt = p_Var14;
    (puVar9->_M_h)._M_before_begin._M_nxt = p_Var6;
    if (p_Var14 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var14[7]._M_nxt % (puVar9->_M_h)._M_bucket_count] = p_Var6;
      __s = (puVar9->_M_h)._M_buckets;
    }
    __s[uVar11] = &(puVar9->_M_h)._M_before_begin;
  }
  else {
    p_Var6->_M_nxt = __s[uVar11]->_M_nxt;
    __s[uVar11]->_M_nxt = p_Var6;
  }
  psVar2 = &(puVar9->_M_h)._M_element_count;
  *psVar2 = *psVar2 + 1;
  return;
}

Assistant:

void Register(const MessageLite* containing_type, int number,
              ExtensionInfo info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry,
                               std::make_pair(containing_type, number), info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << containing_type->GetTypeName() << "\", field number "
               << number << ".";
  }
}